

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QByteArray * __thiscall
QMetaPropertyBuilder::name(QByteArray *__return_storage_ptr__,QMetaPropertyBuilder *this)

{
  QMetaPropertyBuilderPrivate *other;
  
  other = d_func(this);
  if (other == (QMetaPropertyBuilderPrivate *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<char>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char> *)other);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QMetaPropertyBuilder::name() const
{
    QMetaPropertyBuilderPrivate *d = d_func();
    if (d)
        return d->name;
    else
        return QByteArray();
}